

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

void al_invert_transform(ALLEGRO_TRANSFORM *trans)

{
  float fVar1;
  float fVar2;
  float t;
  float det;
  ALLEGRO_TRANSFORM *trans_local;
  
  fVar2 = trans->m[0][0] * trans->m[1][1] + -(trans->m[1][0] * trans->m[0][1]);
  fVar1 = trans->m[3][0];
  trans->m[3][0] = (trans->m[1][0] * trans->m[3][1] + -(fVar1 * trans->m[1][1])) / fVar2;
  trans->m[3][1] = (fVar1 * trans->m[0][1] + -(trans->m[0][0] * trans->m[3][1])) / fVar2;
  fVar1 = trans->m[0][0];
  trans->m[0][0] = trans->m[1][1] / fVar2;
  trans->m[1][1] = fVar1 / fVar2;
  trans->m[0][1] = -trans->m[0][1] / fVar2;
  trans->m[1][0] = -trans->m[1][0] / fVar2;
  return;
}

Assistant:

void al_invert_transform(ALLEGRO_TRANSFORM *trans)
{
   float det, t;
   ASSERT(trans);

   det =  trans->m[0][0] *  trans->m[1][1] -  trans->m[1][0] *  trans->m[0][1];

   t =  trans->m[3][0];
   trans->m[3][0] = ( trans->m[1][0] *  trans->m[3][1] - t *  trans->m[1][1]) / det;
   trans->m[3][1] = (t *  trans->m[0][1] -  trans->m[0][0] *  trans->m[3][1]) / det;

   t =  trans->m[0][0];
   trans->m[0][0] =  trans->m[1][1] / det;
   trans->m[1][1] = t / det;

   trans->m[0][1] = - trans->m[0][1] / det;
   trans->m[1][0] = - trans->m[1][0] / det;
}